

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O1

int unicode_prop1(CharRange *cr,int prop_idx)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  uint32_t *puVar5;
  bool bVar6;
  int iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  byte *pbVar11;
  byte *pbVar12;
  
  pbVar4 = unicode_prop_table[prop_idx];
  uVar3 = unicode_prop_len_table[prop_idx];
  bVar6 = false;
  uVar9 = 0;
  pbVar11 = pbVar4;
  do {
    pbVar12 = pbVar11 + 1;
    bVar1 = *pbVar11;
    uVar10 = (uint)bVar1;
    if (bVar1 < 0x40) {
      uVar8 = uVar9 + (bVar1 >> 3) + 1;
      if (bVar6) {
        iVar7 = cr->len + 2;
        if ((cr->size < iVar7) && (iVar7 = cr_realloc(cr,iVar7), iVar7 != 0)) {
          return -1;
        }
        puVar5 = cr->points;
        iVar7 = cr->len;
        cr->len = iVar7 + 1;
        puVar5[iVar7] = uVar9;
        iVar7 = cr->len;
        cr->len = iVar7 + 1;
        puVar5[iVar7] = uVar8;
      }
      bVar6 = (bool)(bVar6 ^ 1);
      uVar9 = (uVar10 & 7) + uVar8 + 1;
    }
    else {
      uVar8 = uVar9;
      if ((char)bVar1 < '\0') {
        uVar9 = (bVar1 + uVar9) - 0x7f;
      }
      else {
        bVar2 = *pbVar12;
        if (bVar1 < 0x60) {
          pbVar12 = pbVar11 + 2;
          uVar9 = (uVar10 * 0x100 + uVar9 + (uint)bVar2) - 0x3fff;
        }
        else {
          pbVar12 = pbVar11 + 3;
          uVar9 = (uVar10 * 0x10000 + uVar9 + (uint)bVar2 * 0x100 + (uint)pbVar11[2]) - 0x5fffff;
        }
      }
    }
    if (bVar6) {
      iVar7 = cr->len + 2;
      if ((cr->size < iVar7) && (iVar7 = cr_realloc(cr,iVar7), iVar7 != 0)) {
        return -1;
      }
      puVar5 = cr->points;
      iVar7 = cr->len;
      cr->len = iVar7 + 1;
      puVar5[iVar7] = uVar8;
      iVar7 = cr->len;
      cr->len = iVar7 + 1;
      puVar5[iVar7] = uVar9;
    }
    bVar6 = (bool)(bVar6 ^ 1);
    pbVar11 = pbVar12;
    if (pbVar4 + uVar3 <= pbVar12) {
      return 0;
    }
  } while( true );
}

Assistant:

static int unicode_prop1(CharRange *cr, int prop_idx)
{
    const uint8_t *p, *p_end;
    uint32_t c, c0, b, bit;

    p = unicode_prop_table[prop_idx];
    p_end = p + unicode_prop_len_table[prop_idx];
    c = 0;
    bit = 0;
    while (p < p_end) {
        c0 = c;
        b = *p++;
        if (b < 64) {
            c += (b >> 3) + 1;
            if (bit)  {
                if (cr_add_interval(cr, c0, c))
                    return -1;
            }
            bit ^= 1;
            c0 = c;
            c += (b & 7) + 1;
        } else if (b >= 0x80) {
            c += b - 0x80 + 1;
        } else if (b < 0x60) {
            c += (((b - 0x40) << 8) | p[0]) + 1;
            p++;
        } else {
            c += (((b - 0x60) << 16) | (p[0] << 8) | p[1]) + 1;
            p += 2;
        }
        if (bit)  {
            if (cr_add_interval(cr, c0, c))
                return -1;
        }
        bit ^= 1;
    }
    return 0;
}